

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImU32 ImGui::ColorConvertFloat4ToU32(ImVec4 *in)

{
  float *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImU32 out;
  
  fVar1 = ImSaturate(*in_RDI);
  fVar2 = ImSaturate(in_RDI[1]);
  fVar3 = ImSaturate(in_RDI[2]);
  fVar4 = ImSaturate(in_RDI[3]);
  return (int)(fVar4 * 255.0 + 0.5) << 0x18 |
         (int)(fVar3 * 255.0 + 0.5) << 0x10 |
         (int)(fVar2 * 255.0 + 0.5) << 8 | (int)(fVar1 * 255.0 + 0.5);
}

Assistant:

ImU32 ImGui::ColorConvertFloat4ToU32(const ImVec4& in)
{
    ImU32 out;
    out  = ((ImU32)IM_F32_TO_INT8_SAT(in.x)) << IM_COL32_R_SHIFT;
    out |= ((ImU32)IM_F32_TO_INT8_SAT(in.y)) << IM_COL32_G_SHIFT;
    out |= ((ImU32)IM_F32_TO_INT8_SAT(in.z)) << IM_COL32_B_SHIFT;
    out |= ((ImU32)IM_F32_TO_INT8_SAT(in.w)) << IM_COL32_A_SHIFT;
    return out;
}